

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_2,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPU4StateImpl<double,_2,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,int *activateScaling)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  uint local_18c;
  int local_188;
  uint local_184;
  double *local_180;
  double *local_178;
  long local_170;
  BeagleCPU4StateImpl<double,_2,_0> *local_168;
  double *local_160;
  double local_158;
  double dStack_150;
  double dStack_148;
  double dStack_140;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  local_188 = 0;
  local_180 = matrices1;
  local_178 = matrices2;
  local_168 = this;
  local_160 = destP;
  for (local_170 = 0; local_170 < (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
      local_170 = local_170 + 1) {
    iVar16 = 0;
    auVar17 = vpbroadcastq_avx512vl();
    vpaddq_avx(auVar17._0_16_,_DAT_00149030);
    vpaddq_avx2(auVar17,_DAT_00149060);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_170 * 0x18 | 6;
    vpunpcklqdq_avx(auVar17._0_16_,auVar19);
    uVar12 = (this->super_BeagleCPUImpl<double,_2,_0>).kPaddedPatternCount * local_188;
    lVar14 = (long)(int)uVar12;
    lVar15 = lVar14 << 3;
    vpaddq_avx2(auVar17,_DAT_00149040);
    vpaddq_avx2(auVar17,_DAT_00149080);
    local_58 = vgatherqpd_avx512vl(local_180[(long)activateScaling]);
    auVar22 = ZEXT3264(local_58);
    local_78 = vgatherqpd_avx512vl(local_180[uVar12]);
    auVar23 = ZEXT3264(local_78);
    local_98 = vgatherqpd_avx512vl(local_180[lVar14 * 8]);
    auVar24 = ZEXT3264(local_98);
    local_b8 = vgatherqpd_avx512vl(*(undefined8 *)((long)local_180 * 9));
    auVar25 = ZEXT3264(local_b8);
    local_d8 = vgatherqpd_avx512vl(local_178[(long)activateScaling]);
    auVar26 = ZEXT3264(local_d8);
    local_f8 = vgatherqpd_avx512vl(local_178[uVar12]);
    auVar27 = ZEXT3264(local_f8);
    local_118 = vgatherqpd_avx512vl(local_178[lVar14 * 8]);
    auVar20 = ZEXT3264(local_118);
    local_138 = vgatherqpd_avx512vl(local_178[(long)local_180]);
    auVar21 = ZEXT3264(local_138);
    for (; iVar16 < (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount; iVar16 = iVar16 + 1) {
      uVar2 = *(undefined8 *)((long)partials1 + lVar15 + 8);
      auVar17._8_8_ = uVar2;
      auVar17._0_8_ = uVar2;
      auVar17._16_8_ = uVar2;
      auVar17._24_8_ = uVar2;
      auVar17 = vmulpd_avx512vl(auVar23._0_32_,auVar17);
      uVar2 = *(undefined8 *)((long)partials2 + lVar15 + 8);
      auVar18._8_8_ = uVar2;
      auVar18._0_8_ = uVar2;
      auVar18._16_8_ = uVar2;
      auVar18._24_8_ = uVar2;
      auVar18 = vmulpd_avx512vl(auVar27._0_32_,auVar18);
      uVar2 = *(undefined8 *)((long)partials1 + lVar15);
      auVar3._8_8_ = uVar2;
      auVar3._0_8_ = uVar2;
      auVar3._16_8_ = uVar2;
      auVar3._24_8_ = uVar2;
      auVar17 = vfmadd231pd_avx512vl(auVar17,auVar22._0_32_,auVar3);
      uVar2 = *(undefined8 *)((long)partials2 + lVar15);
      auVar4._8_8_ = uVar2;
      auVar4._0_8_ = uVar2;
      auVar4._16_8_ = uVar2;
      auVar4._24_8_ = uVar2;
      auVar18 = vfmadd231pd_avx512vl(auVar18,auVar26._0_32_,auVar4);
      uVar2 = *(undefined8 *)((long)partials1 + lVar15 + 0x10);
      auVar5._8_8_ = uVar2;
      auVar5._0_8_ = uVar2;
      auVar5._16_8_ = uVar2;
      auVar5._24_8_ = uVar2;
      auVar17 = vfmadd231pd_avx512vl(auVar17,auVar24._0_32_,auVar5);
      uVar2 = *(undefined8 *)((long)partials2 + lVar15 + 0x10);
      auVar6._8_8_ = uVar2;
      auVar6._0_8_ = uVar2;
      auVar6._16_8_ = uVar2;
      auVar6._24_8_ = uVar2;
      auVar18 = vfmadd231pd_avx512vl(auVar18,auVar20._0_32_,auVar6);
      uVar2 = *(undefined8 *)((long)partials1 + lVar15 + 0x18);
      auVar7._8_8_ = uVar2;
      auVar7._0_8_ = uVar2;
      auVar7._16_8_ = uVar2;
      auVar7._24_8_ = uVar2;
      auVar17 = vfmadd231pd_avx512vl(auVar17,auVar25._0_32_,auVar7);
      uVar2 = *(undefined8 *)((long)partials2 + lVar15 + 0x18);
      auVar8._8_8_ = uVar2;
      auVar8._0_8_ = uVar2;
      auVar8._16_8_ = uVar2;
      auVar8._24_8_ = uVar2;
      auVar18 = vfmadd231pd_avx512vl(auVar18,auVar21._0_32_,auVar8);
      local_158 = auVar17._0_8_ * auVar18._0_8_;
      dStack_150 = auVar17._8_8_ * auVar18._8_8_;
      dStack_148 = auVar17._16_8_ * auVar18._16_8_;
      dStack_140 = auVar17._24_8_ * auVar18._24_8_;
      pdVar1 = (double *)((long)destP + lVar15);
      *pdVar1 = local_158;
      pdVar1[1] = dStack_150;
      pdVar1[2] = dStack_148;
      pdVar1[3] = dStack_140;
      if (*activateScaling == 0) {
        frexp(local_158,(int *)&local_184);
        auVar10._8_8_ = dStack_150;
        auVar10._0_8_ = local_158;
        auVar19 = vpermilpd_avx(auVar10,1);
        frexp(auVar19._0_8_,(int *)&local_18c);
        uVar12 = -local_18c;
        if (0 < (int)local_18c) {
          uVar12 = local_18c;
        }
        uVar13 = -local_184;
        if (0 < (int)local_184) {
          uVar13 = local_184;
        }
        uVar9 = local_184;
        if (uVar13 < uVar12) {
          uVar9 = local_18c;
        }
        frexp(dStack_148,(int *)&local_18c);
        auVar11._8_8_ = dStack_150;
        auVar11._0_8_ = local_158;
        auVar19 = vpermilpd_avx(auVar11,1);
        uVar12 = -local_18c;
        if (0 < (int)local_18c) {
          uVar12 = local_18c;
        }
        uVar13 = -uVar9;
        if (0 < (int)uVar9) {
          uVar13 = uVar9;
        }
        if (uVar13 < uVar12) {
          uVar9 = local_18c;
        }
        frexp(auVar19._0_8_,(int *)&local_18c);
        uVar12 = -local_18c;
        if (0 < (int)local_18c) {
          uVar12 = local_18c;
        }
        uVar13 = -uVar9;
        if (0 < (int)uVar9) {
          uVar13 = uVar9;
        }
        if (uVar13 < uVar12) {
          uVar9 = local_18c;
        }
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        if ((local_168->super_BeagleCPUImpl<double,_2,_0>).scalingExponentThreshold < (int)uVar12) {
          *activateScaling = 1;
        }
        auVar22 = ZEXT3264(local_58);
        auVar23 = ZEXT3264(local_78);
        auVar24 = ZEXT3264(local_98);
        auVar25 = ZEXT3264(local_b8);
        auVar26 = ZEXT3264(local_d8);
        auVar27 = ZEXT3264(local_f8);
        auVar20 = ZEXT3264(local_118);
        auVar21 = ZEXT3264(local_138);
        destP = local_160;
        this = local_168;
      }
      lVar15 = lVar15 + 0x20;
    }
    local_188 = local_188 + 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const REALTYPE* partials2,
                                                                    const REALTYPE* matrices2,
                                                                    int* activateScaling) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = 0; k < kPatternCount; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            if (*activateScaling == 0) {
                int expTmp;
                int expMax;
                frexp(destP[u], &expMax);
                frexp(destP[u + 1], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 2], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 3], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;

                if(abs(expMax) > scalingExponentThreshold) {
                    *activateScaling = 1;
                }
            }

            u += 4;

        }
    }
}